

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picklpf.c
# Opt level: O0

void av1_pick_filter_level(YV12_BUFFER_CONFIG *sd,AV1_COMP *cpi,LPF_PICK_METHOD method)

{
  aom_bit_depth_t aVar1;
  uint uVar2;
  SequenceHeader *pSVar3;
  int16_t iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  AV1_COMMON *cm_00;
  loopfilter *plVar8;
  int64_t iVar9;
  RefCntBuffer *pRVar10;
  byte in_DL;
  AV1_COMP *in_RSI;
  bool bVar11;
  int unaff_retaddr;
  int in_stack_00000008;
  aom_codec_frame_buffer_t *in_stack_00000010;
  aom_get_frame_buffer_cb_fn_t in_stack_00000018;
  void *in_stack_00000020;
  int in_stack_00000030;
  double pct_improvement_sse;
  int plane_1;
  _Bool reset_filter_level_y_1;
  double pct_improvement_thresh;
  _Bool reset_filter_level_y;
  int filter_threshold;
  uint pyramid_level;
  RefCntBuffer *buf;
  int ref;
  int32_t min_ref_filter_level [2];
  int plane;
  int64_t best_filter_sse [3];
  int64_t zero_filter_sse [3];
  int last_frame_filter_level [4];
  int distance_since_key_thresh;
  int newmv_thresh;
  int num4x4;
  int filt_guess;
  int inter_frame_multiplier;
  int strength_boost_q_treshold;
  int q;
  int max_filter_level;
  int min_filter_level;
  int disable_filter_rt_screen;
  loopfilter *lf;
  int num_planes;
  SequenceHeader *seq_params;
  AV1_COMMON *cm;
  AV1_COMP *in_stack_fffffffffffffea8;
  undefined4 uVar14;
  undefined8 uVar12;
  long *plVar13;
  int in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  YV12_BUFFER_CONFIG *a;
  int local_110;
  int local_10c;
  int local_108;
  int local_fc;
  int local_f0;
  int local_d8;
  int local_c8;
  int local_c4;
  int iStack_c0;
  int local_bc;
  long local_b8 [4];
  int64_t local_98;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined1 alloc_pyramid;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_3c;
  
  alloc_pyramid = (undefined1)((uint)in_stack_ffffffffffffffa0 >> 0x18);
  cm_00 = &in_RSI->common;
  pSVar3 = (in_RSI->common).seq_params;
  iVar5 = av1_num_planes(cm_00);
  plVar8 = &(in_RSI->common).lf;
  local_3c = 0;
  if ((in_RSI->oxcf).mode == '\x02') {
    local_fc = (in_RSI->oxcf).algo_cfg.sharpness;
  }
  else {
    local_fc = 0;
  }
  (in_RSI->common).lf.sharpness_level = local_fc;
  if ((((in_RSI->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) &&
      ((in_RSI->oxcf).q_cfg.aq_mode == '\x03')) && ((in_RSI->sf).rt_sf.skip_lf_screen != 0)) {
    local_3c = av1_cyclic_refresh_disable_lf_cdef(in_RSI);
  }
  if (((local_3c == 0) && ((in_RSI->oxcf).algo_cfg.loopfilter_control != LOOPFILTER_NONE)) &&
     (((in_RSI->oxcf).algo_cfg.loopfilter_control != LOOPFILTER_REFERENCE ||
      ((in_RSI->ppi->rtc_ref).non_reference_frame == 0)))) {
    if (in_DL == 4) {
      plVar8->filter_level[0] = 0;
      (in_RSI->common).lf.filter_level[1] = 0;
    }
    else if (in_DL < 3) {
      memset(&local_78,0,0x10);
      uVar14 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
      iVar6 = frame_is_intra_only(cm_00);
      if (iVar6 == 0) {
        local_78 = in_RSI->ppi->filter_level[0];
        local_74 = in_RSI->ppi->filter_level[1];
        local_70 = in_RSI->ppi->filter_level_u;
        local_6c = in_RSI->ppi->filter_level_v;
      }
      iVar6 = (in_RSI->common).features.byte_alignment;
      uVar12 = CONCAT44(uVar14,(in_RSI->oxcf).border_in_pixels);
      a = (YV12_BUFFER_CONFIG *)0x0;
      iVar7 = aom_realloc_frame_buffer
                        ((YV12_BUFFER_CONFIG *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                         in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
                         in_stack_ffffffffffffffa4,unaff_retaddr,in_stack_00000008,in_stack_00000010
                         ,in_stack_00000018,in_stack_00000020,(_Bool)alloc_pyramid,in_stack_00000030
                        );
      if (iVar7 != 0) {
        aom_internal_error((in_RSI->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate last frame buffer");
      }
      memset(&local_98,0,0x18);
      memset(local_b8,0,0x18);
      if (0 < (in_RSI->sf).lpf_sf.skip_loop_filter_using_filt_error) {
        for (local_bc = 0; local_bc < iVar5; local_bc = local_bc + 1) {
          iVar9 = aom_get_sse_plane(a,(YV12_BUFFER_CONFIG *)
                                      CONCAT44(in_stack_fffffffffffffeb4,iVar6),
                                    (int)((ulong)uVar12 >> 0x20),(int)uVar12);
          (&local_98)[local_bc] = iVar9;
        }
      }
      plVar13 = local_b8;
      iVar7 = search_filter_level((YV12_BUFFER_CONFIG *)cm,(AV1_COMP *)seq_params,num_planes,
                                  lf->filter_level,disable_filter_rt_screen,min_filter_level,
                                  (int64_t *)sd);
      (in_RSI->common).lf.filter_level[1] = iVar7;
      plVar8->filter_level[0] = iVar7;
      if (in_DL != 1) {
        iVar7 = search_filter_level((YV12_BUFFER_CONFIG *)cm,(AV1_COMP *)seq_params,num_planes,
                                    lf->filter_level,disable_filter_rt_screen,min_filter_level,
                                    (int64_t *)sd);
        plVar8->filter_level[0] = iVar7;
        plVar13 = local_b8;
        iVar7 = search_filter_level((YV12_BUFFER_CONFIG *)cm,(AV1_COMP *)seq_params,num_planes,
                                    lf->filter_level,disable_filter_rt_screen,min_filter_level,
                                    (int64_t *)sd);
        (in_RSI->common).lf.filter_level[1] = iVar7;
      }
      if (1 < iVar5) {
        iVar7 = search_filter_level((YV12_BUFFER_CONFIG *)cm,(AV1_COMP *)seq_params,num_planes,
                                    lf->filter_level,disable_filter_rt_screen,min_filter_level,
                                    (int64_t *)sd);
        (in_RSI->common).lf.filter_level_u = iVar7;
        plVar13 = local_b8 + 2;
        iVar7 = search_filter_level((YV12_BUFFER_CONFIG *)cm,(AV1_COMP *)seq_params,num_planes,
                                    lf->filter_level,disable_filter_rt_screen,min_filter_level,
                                    (int64_t *)sd);
        (in_RSI->common).lf.filter_level_v = iVar7;
      }
      (in_RSI->common).lf.backup_filter_level[0] = plVar8->filter_level[0];
      (in_RSI->common).lf.backup_filter_level[1] = (in_RSI->common).lf.filter_level[1];
      (in_RSI->common).lf.backup_filter_level_u = (in_RSI->common).lf.filter_level_u;
      (in_RSI->common).lf.backup_filter_level_v = (in_RSI->common).lf.filter_level_v;
      if (0 < (in_RSI->sf).lpf_sf.adaptive_luma_loop_filter_skip) {
        local_c4 = 0x3f;
        iStack_c0 = 0x3f;
        for (local_c8 = 1; local_c8 < 8; local_c8 = local_c8 + 1) {
          pRVar10 = get_ref_frame_buf((AV1_COMMON *)CONCAT44(in_stack_fffffffffffffeb4,iVar6),
                                      (MV_REFERENCE_FRAME)((ulong)plVar13 >> 0x38));
          if (pRVar10 != (RefCntBuffer *)0x0) {
            if (pRVar10->filter_level[0] != -1) {
              if (local_c4 < pRVar10->filter_level[0]) {
                local_10c = local_c4;
              }
              else {
                local_10c = pRVar10->filter_level[0];
              }
              local_c4 = local_10c;
            }
            if (pRVar10->filter_level[1] != -1) {
              if (iStack_c0 < pRVar10->filter_level[1]) {
                local_110 = iStack_c0;
              }
              else {
                local_110 = pRVar10->filter_level[1];
              }
              iStack_c0 = local_110;
            }
          }
        }
        uVar2 = (in_RSI->common).current_frame.pyramid_level;
        if (1 < uVar2) {
          if (uVar2 < 5) {
            if (uVar2 < 4) {
              local_d8 = 8;
            }
            else {
              local_d8 = 0x10;
            }
          }
          else {
            local_d8 = 0x20;
          }
          bVar11 = false;
          if (((plVar8->filter_level[0] < local_d8) &&
              (bVar11 = false, (in_RSI->common).lf.filter_level[1] < local_d8)) &&
             ((bVar11 = false, (in_RSI->common).lf.filter_level_u < local_d8 &&
              ((bVar11 = false, (in_RSI->common).lf.filter_level_v < local_d8 &&
               (bVar11 = false, local_c4 == 0)))))) {
            bVar11 = iStack_c0 == 0;
          }
          if (bVar11) {
            plVar8->filter_level[0] = 0;
            (in_RSI->common).lf.filter_level[1] = 0;
          }
        }
      }
      if (((plVar8->filter_level[0] != 0) && ((in_RSI->common).lf.filter_level[1] != 0)) &&
         (0 < (in_RSI->sf).lpf_sf.skip_loop_filter_using_filt_error)) {
        bVar11 = true;
        for (local_f0 = 0; local_f0 < iVar5; local_f0 = local_f0 + 1) {
          bVar11 = (bool)(bVar11 & ((double)((&local_98)[local_f0] - local_b8[local_f0]) * 100.0) /
                                   (double)(&local_98)[local_f0] < 2.0);
        }
        if (bVar11) {
          plVar8->filter_level[0] = 0;
          (in_RSI->common).lf.filter_level[1] = 0;
        }
      }
      ((in_RSI->common).cur_frame)->filter_level[0] = plVar8->filter_level[0];
      ((in_RSI->common).cur_frame)->filter_level[1] = (in_RSI->common).lf.filter_level[1];
    }
    else {
      iVar5 = get_max_filter_level(in_stack_fffffffffffffea8);
      iVar4 = av1_ac_quant_QTX(in_stack_fffffffffffffeb0,
                               (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                               (aom_bit_depth_t)in_stack_fffffffffffffea8);
      iVar6 = (int)iVar4;
      bVar11 = true;
      if ((iVar6 < 1) && (bVar11 = false, (in_RSI->sf).rt_sf.use_nonrd_pick_mode != 0)) {
        bVar11 = 0x18c00 < (in_RSI->common).width * (in_RSI->common).height;
      }
      iVar7 = 0x1781;
      if (bVar11) {
        iVar7 = 0x2f02;
      }
      if ((((in_RSI->svc).number_temporal_layers < 2) || ((in_RSI->svc).temporal_layer_id != 0)) ||
         ((0x18c00 < (in_RSI->common).width * (in_RSI->common).height ||
          ((in_RSI->sf).rt_sf.use_nonrd_pick_mode == 0)))) {
        if ((in_RSI->sf).rt_sf.use_fast_fixed_part != 0) {
          iVar7 = iVar7 << 1;
        }
      }
      else if ((in_RSI->rc).frame_source_sad < 0x186a1) {
        if (50000 < (in_RSI->rc).frame_source_sad) {
          iVar7 = (iVar7 >> 1) * 3;
        }
      }
      else {
        iVar7 = iVar7 << 1;
      }
      aVar1 = pSVar3->bit_depth;
      if (aVar1 == AOM_BITS_8) {
        if ((cm_00->current_frame).frame_type == '\0') {
          local_108 = iVar6 * 0x449b + -0x46ec6;
        }
        else {
          local_108 = iVar6 * iVar7 + 0xbedd3;
        }
        local_108 = local_108 >> 0x12;
      }
      else if (aVar1 == AOM_BITS_10) {
        local_108 = iVar6 * 0x50f3 + 0x45f5d8 >> 0x14;
      }
      else {
        if (aVar1 != AOM_BITS_12) {
          return;
        }
        local_108 = iVar6 * 0x50f3 + 0x117d75e >> 0x16;
      }
      if ((pSVar3->bit_depth != AOM_BITS_8) && ((cm_00->current_frame).frame_type == '\0')) {
        local_108 = local_108 + -4;
      }
      iVar6 = clamp(local_108,0,iVar5);
      plVar8->filter_level[0] = iVar6;
      iVar6 = clamp(local_108,0,iVar5);
      (in_RSI->common).lf.filter_level[1] = iVar6;
      iVar6 = clamp(local_108,0,iVar5);
      (in_RSI->common).lf.filter_level_u = iVar6;
      iVar5 = clamp(local_108,0,iVar5);
      (in_RSI->common).lf.filter_level_v = iVar5;
      if ((((in_RSI->oxcf).algo_cfg.loopfilter_control == LOOPFILTER_SELECTIVELY) &&
          (iVar5 = frame_is_intra_only(cm_00), iVar5 == 0)) && ((in_RSI->rc).high_source_sad == 0))
      {
        if ((in_RSI->oxcf).tune_cfg.content == AOM_CONTENT_SCREEN) {
          plVar8->filter_level[0] = 0;
          (in_RSI->common).lf.filter_level[1] = 0;
        }
        else if ((((in_RSI->td).rd_counts.newmv_or_intra_blocks * 100) /
                  (((in_RSI->common).width >> 2) * ((in_RSI->common).height >> 2)) < 7) &&
                (5 < (in_RSI->rc).frames_since_key)) {
          plVar8->filter_level[0] = 0;
          (in_RSI->common).lf.filter_level[1] = 0;
        }
      }
    }
  }
  else {
    plVar8->filter_level[0] = 0;
    (in_RSI->common).lf.filter_level[1] = 0;
  }
  return;
}

Assistant:

void av1_pick_filter_level(const YV12_BUFFER_CONFIG *sd, AV1_COMP *cpi,
                           LPF_PICK_METHOD method) {
  AV1_COMMON *const cm = &cpi->common;
  const SequenceHeader *const seq_params = cm->seq_params;
  const int num_planes = av1_num_planes(cm);
  struct loopfilter *const lf = &cm->lf;
  int disable_filter_rt_screen = 0;
  (void)sd;

  // Enable loop filter sharpness only for allintra encoding mode,
  // as frames do not have to serve as references to others
  lf->sharpness_level =
      cpi->oxcf.mode == ALLINTRA ? cpi->oxcf.algo_cfg.sharpness : 0;

  if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN &&
      cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
      cpi->sf.rt_sf.skip_lf_screen)
    disable_filter_rt_screen = av1_cyclic_refresh_disable_lf_cdef(cpi);

  if (disable_filter_rt_screen ||
      cpi->oxcf.algo_cfg.loopfilter_control == LOOPFILTER_NONE ||
      (cpi->oxcf.algo_cfg.loopfilter_control == LOOPFILTER_REFERENCE &&
       cpi->ppi->rtc_ref.non_reference_frame)) {
    lf->filter_level[0] = 0;
    lf->filter_level[1] = 0;
    return;
  }

  if (method == LPF_PICK_MINIMAL_LPF) {
    lf->filter_level[0] = 0;
    lf->filter_level[1] = 0;
  } else if (method >= LPF_PICK_FROM_Q) {
    const int min_filter_level = 0;
    const int max_filter_level = get_max_filter_level(cpi);
    const int q = av1_ac_quant_QTX(cm->quant_params.base_qindex, 0,
                                   seq_params->bit_depth);
    // based on tests result for rtc test set
    // 0.04590 boosted or 0.02295 non-booseted in 18-bit fixed point
    const int strength_boost_q_treshold = 0;
    int inter_frame_multiplier =
        (q > strength_boost_q_treshold ||
         (cpi->sf.rt_sf.use_nonrd_pick_mode &&
          cpi->common.width * cpi->common.height > 352 * 288))
            ? 12034
            : 6017;
    // Increase strength on base TL0 for temporal layers, for low-resoln,
    // based on frame source_sad.
    if (cpi->svc.number_temporal_layers > 1 &&
        cpi->svc.temporal_layer_id == 0 &&
        cpi->common.width * cpi->common.height <= 352 * 288 &&
        cpi->sf.rt_sf.use_nonrd_pick_mode) {
      if (cpi->rc.frame_source_sad > 100000)
        inter_frame_multiplier = inter_frame_multiplier << 1;
      else if (cpi->rc.frame_source_sad > 50000)
        inter_frame_multiplier = 3 * (inter_frame_multiplier >> 1);
    } else if (cpi->sf.rt_sf.use_fast_fixed_part) {
      inter_frame_multiplier = inter_frame_multiplier << 1;
    }
    // These values were determined by linear fitting the result of the
    // searched level for 8 bit depth:
    // Keyframes: filt_guess = q * 0.06699 - 1.60817
    // Other frames: filt_guess = q * inter_frame_multiplier + 2.48225
    //
    // And high bit depth separately:
    // filt_guess = q * 0.316206 + 3.87252
    int filt_guess;
    switch (seq_params->bit_depth) {
      case AOM_BITS_8:
        filt_guess =
            (cm->current_frame.frame_type == KEY_FRAME)
                ? ROUND_POWER_OF_TWO(q * 17563 - 421574, 18)
                : ROUND_POWER_OF_TWO(q * inter_frame_multiplier + 650707, 18);
        break;
      case AOM_BITS_10:
        filt_guess = ROUND_POWER_OF_TWO(q * 20723 + 4060632, 20);
        break;
      case AOM_BITS_12:
        filt_guess = ROUND_POWER_OF_TWO(q * 20723 + 16242526, 22);
        break;
      default:
        assert(0 &&
               "bit_depth should be AOM_BITS_8, AOM_BITS_10 "
               "or AOM_BITS_12");
        return;
    }
    if (seq_params->bit_depth != AOM_BITS_8 &&
        cm->current_frame.frame_type == KEY_FRAME)
      filt_guess -= 4;
    // TODO(chengchen): retrain the model for Y, U, V filter levels
    lf->filter_level[0] = clamp(filt_guess, min_filter_level, max_filter_level);
    lf->filter_level[1] = clamp(filt_guess, min_filter_level, max_filter_level);
    lf->filter_level_u = clamp(filt_guess, min_filter_level, max_filter_level);
    lf->filter_level_v = clamp(filt_guess, min_filter_level, max_filter_level);
    if (cpi->oxcf.algo_cfg.loopfilter_control == LOOPFILTER_SELECTIVELY &&
        !frame_is_intra_only(cm) && !cpi->rc.high_source_sad) {
      if (cpi->oxcf.tune_cfg.content == AOM_CONTENT_SCREEN) {
        lf->filter_level[0] = 0;
        lf->filter_level[1] = 0;
      } else {
        const int num4x4 = (cm->width >> 2) * (cm->height >> 2);
        const int newmv_thresh = 7;
        const int distance_since_key_thresh = 5;
        if ((cpi->td.rd_counts.newmv_or_intra_blocks * 100 / num4x4) <
                newmv_thresh &&
            cpi->rc.frames_since_key > distance_since_key_thresh) {
          lf->filter_level[0] = 0;
          lf->filter_level[1] = 0;
        }
      }
    }
  } else {
    int last_frame_filter_level[4] = { 0 };
    if (!frame_is_intra_only(cm)) {
      last_frame_filter_level[0] = cpi->ppi->filter_level[0];
      last_frame_filter_level[1] = cpi->ppi->filter_level[1];
      last_frame_filter_level[2] = cpi->ppi->filter_level_u;
      last_frame_filter_level[3] = cpi->ppi->filter_level_v;
    }
    // The frame buffer last_frame_uf is used to store the non-loop filtered
    // reconstructed frame in search_filter_level().
    if (aom_realloc_frame_buffer(
            &cpi->last_frame_uf, cm->width, cm->height,
            seq_params->subsampling_x, seq_params->subsampling_y,
            seq_params->use_highbitdepth, cpi->oxcf.border_in_pixels,
            cm->features.byte_alignment, NULL, NULL, NULL, false, 0))
      aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate last frame buffer");

    int64_t zero_filter_sse[MAX_MB_PLANE] = { 0 };
    int64_t best_filter_sse[MAX_MB_PLANE] = { 0 };

    if (cpi->sf.lpf_sf.skip_loop_filter_using_filt_error >= 1) {
      for (int plane = 0; plane < num_planes; plane++) {
        zero_filter_sse[plane] = aom_get_sse_plane(
            sd, &cm->cur_frame->buf, plane, cm->seq_params->use_highbitdepth);
      }
    }

    lf->filter_level[0] = lf->filter_level[1] =
        search_filter_level(sd, cpi, method == LPF_PICK_FROM_SUBIMAGE,
                            last_frame_filter_level, 0, 2, &best_filter_sse[0]);
    if (method != LPF_PICK_FROM_FULL_IMAGE_NON_DUAL) {
      lf->filter_level[0] = search_filter_level(
          sd, cpi, method == LPF_PICK_FROM_SUBIMAGE, last_frame_filter_level, 0,
          0, &best_filter_sse[0]);
      lf->filter_level[1] = search_filter_level(
          sd, cpi, method == LPF_PICK_FROM_SUBIMAGE, last_frame_filter_level, 0,
          1, &best_filter_sse[0]);
    }

    if (num_planes > 1) {
      lf->filter_level_u = search_filter_level(
          sd, cpi, method == LPF_PICK_FROM_SUBIMAGE, last_frame_filter_level, 1,
          0, &best_filter_sse[1]);
      lf->filter_level_v = search_filter_level(
          sd, cpi, method == LPF_PICK_FROM_SUBIMAGE, last_frame_filter_level, 2,
          0, &best_filter_sse[2]);
    }

    lf->backup_filter_level[0] = lf->filter_level[0];
    lf->backup_filter_level[1] = lf->filter_level[1];
    lf->backup_filter_level_u = lf->filter_level_u;
    lf->backup_filter_level_v = lf->filter_level_v;

    if (cpi->sf.lpf_sf.adaptive_luma_loop_filter_skip >= 1) {
      int32_t min_ref_filter_level[2] = { MAX_LOOP_FILTER, MAX_LOOP_FILTER };
      // Find the minimum luma filter levels across all reference frames.
      for (int ref = LAST_FRAME; ref <= ALTREF_FRAME; ++ref) {
        const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref);
        if (buf == NULL) continue;

        if (buf->filter_level[0] != -1)
          min_ref_filter_level[0] =
              AOMMIN(min_ref_filter_level[0], buf->filter_level[0]);
        if (buf->filter_level[1] != -1)
          min_ref_filter_level[1] =
              AOMMIN(min_ref_filter_level[1], buf->filter_level[1]);
      }

      // Reset luma filter levels to zero based on minimum filter levels of
      // reference frames and current frame's pyramid level.
      unsigned int pyramid_level = cm->current_frame.pyramid_level;
      if (pyramid_level > 1) {
        int filter_threshold;
        if (pyramid_level >= 5)
          filter_threshold = 32;
        else if (pyramid_level >= 4)
          filter_threshold = 16;
        else
          filter_threshold = 8;

        const bool reset_filter_level_y =
            lf->filter_level[0] < filter_threshold &&
            lf->filter_level[1] < filter_threshold &&
            lf->filter_level_u < filter_threshold &&
            lf->filter_level_v < filter_threshold &&
            min_ref_filter_level[0] == 0 && min_ref_filter_level[1] == 0;
        if (reset_filter_level_y) {
          lf->filter_level[0] = 0;
          lf->filter_level[1] = 0;
        }
      }
    }

    if (lf->filter_level[0] != 0 && lf->filter_level[1] != 0 &&
        cpi->sf.lpf_sf.skip_loop_filter_using_filt_error >= 1) {
      const double pct_improvement_thresh = 2.0;
      bool reset_filter_level_y = true;

      // Calculate the percentage improvement in SSE for each plane. This
      // measures the relative reduction in error when applying the filter
      // compared to no filtering.
      for (int plane = 0; plane < num_planes; plane++) {
        const double pct_improvement_sse =
            ((zero_filter_sse[plane] - best_filter_sse[plane]) * 100.0) /
            zero_filter_sse[plane];
        reset_filter_level_y &= pct_improvement_sse < pct_improvement_thresh;
      }

      if (reset_filter_level_y) {
        lf->filter_level[0] = 0;
        lf->filter_level[1] = 0;
      }
    }

    // Store the current frame's filter levels to be referenced
    // while determining the minimum filter level from reference frames.
    cm->cur_frame->filter_level[0] = lf->filter_level[0];
    cm->cur_frame->filter_level[1] = lf->filter_level[1];
  }
}